

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

void __thiscall Expr::Expr(Expr *this,Expr *index,CaseExprList *cases)

{
  bool bVar1;
  char *pcVar2;
  reference ppCVar3;
  undefined8 uVar4;
  int __c;
  CaseExprList *in_RDX;
  Expr *in_RSI;
  EVP_PKEY_CTX *ctx;
  CaseExpr ***__s;
  Expr *in_RDI;
  CaseExpr *c;
  iterator i;
  vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *in_stack_ffffffffffffff18;
  __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
  *in_stack_ffffffffffffff20;
  Object *in_stack_ffffffffffffff60;
  string local_80 [32];
  CaseExpr *local_60;
  CaseExpr **local_58;
  __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_> local_50;
  string local_48 [48];
  CaseExprList *local_18;
  Expr *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Object::Object(in_stack_ffffffffffffff60);
  ctx = (EVP_PKEY_CTX *)0x2;
  DataDepElement::DataDepElement(&in_RDI->super_DataDepElement,EXPR);
  (in_RDI->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Expr_00179cb0;
  std::__cxx11::string::string((string *)&in_RDI->str_);
  std::__cxx11::string::string((string *)&in_RDI->orig_);
  init(in_RDI,ctx);
  in_RDI->expr_type_ = EXPR_CASE;
  in_RDI->num_operands_ = -1;
  in_RDI->operand_[0] = local_10;
  in_RDI->cases_ = local_18;
  pcVar2 = orig((Expr *)0x132c11);
  strfmt_abi_cxx11_((char *)local_48,"case %s of { ",pcVar2);
  std::__cxx11::string::operator=((string *)&in_RDI->orig_,local_48);
  std::__cxx11::string::~string(local_48);
  if (in_RDI->cases_ != (CaseExprList *)0x0) {
    local_50._M_current =
         (CaseExpr **)
         std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::begin(in_stack_ffffffffffffff18);
    while( true ) {
      local_58 = (CaseExpr **)
                 std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::end
                           (in_stack_ffffffffffffff18);
      __s = &local_58;
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff20,
                         (__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                          *)in_stack_ffffffffffffff18);
      if (!bVar1) break;
      ppCVar3 = __gnu_cxx::
                __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                ::operator*(&local_50);
      local_60 = *ppCVar3;
      CaseExpr::index(local_60,(char *)__s,__c);
      OrigExprList_abi_cxx11_((ExprList *)in_RDI);
      uVar4 = std::__cxx11::string::c_str();
      CaseExpr::value(local_60);
      in_stack_ffffffffffffff20 =
           (__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_> *)
           orig((Expr *)0x132d28);
      strfmt_abi_cxx11_((char *)local_80,"%s => %s; ",uVar4,in_stack_ffffffffffffff20);
      std::__cxx11::string::operator+=((string *)&in_RDI->orig_,local_80);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      __gnu_cxx::
      __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>::
      operator++(&local_50);
    }
  }
  std::__cxx11::string::operator+=((string *)&in_RDI->orig_,"}");
  return;
}

Assistant:

Expr::Expr(Expr* index, CaseExprList* cases) : DataDepElement(EXPR)
	{
	init();
	expr_type_ = EXPR_CASE;
	num_operands_ = -1;
	operand_[0] = index;
	cases_ = cases;

	orig_ = strfmt("case %s of { ", index->orig());
	foreach (i, CaseExprList, cases_)
		{
		CaseExpr* c = *i;
		orig_ += strfmt("%s => %s; ", OrigExprList(c->index()).c_str(), c->value()->orig());
		}
	orig_ += "}";
	}